

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

BrailleCanvas * __thiscall
plot::BrailleCanvas::line(BrailleCanvas *this,Color *color,Point from,Point to,TerminalOp op)

{
  Rect rct;
  ulong uVar1;
  BrailleCanvas *pBVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long p;
  long lVar7;
  anon_class_32_4_3ac4ecb1 local_50;
  
  lVar6 = to.x;
  lVar3 = from.y;
  lVar5 = from.x;
  lVar4 = lVar5;
  lVar7 = to.y;
  if (lVar6 < lVar5) {
    lVar4 = lVar6;
    lVar6 = lVar5;
    lVar7 = lVar3;
    lVar3 = to.y;
  }
  p = (lVar6 - lVar4) + 1;
  uVar1 = lVar7 - lVar3;
  lVar5 = (((long)uVar1 >> 0x3f) + uVar1) - ((long)~uVar1 >> 0x3f);
  local_50.dy = utils::gcd<long>(p,lVar5);
  local_50.dx = p / local_50.dy;
  local_50.dy = lVar5 / local_50.dy;
  rct.p1.y = lVar3;
  rct.p1.x = lVar4;
  rct.p2.x = lVar6;
  rct.p2.y = lVar7;
  local_50.x0 = lVar4;
  local_50.y0 = lVar3;
  pBVar2 = stroke<plot::BrailleCanvas::line(plot::Color_const&,plot::GenericPoint<long>,plot::GenericPoint<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (this,color,rct,&local_50,op);
  return pBVar2;
}

Assistant:

BrailleCanvas& line(Color const& color, Point from, Point to, TerminalOp op = TerminalOp::Over) {
        auto sorted = Rect(from, to).sorted_x();
        auto dx = (sorted.p2.x - sorted.p1.x) + 1,
             dy = sorted.p2.y - sorted.p1.y;

        dy += (dy >= 0) - (dy < 0);

        auto gcd = utils::gcd(dx, dy);
        dx /= gcd; dy /= gcd;

        return stroke(color, sorted, [dx, dy, x0 = sorted.p1.x, y0 = sorted.p1.y](Coord x) {
            auto base = (x - x0)*dy/dx + y0,
                 end_ = (1 + x - x0)*dy/dx + y0;
            return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
        }, op);
    }